

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_writer_writetext(FILE *out,sylvan_skiplist_t sl)

{
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  MTBDD MVar4;
  mtbddnode_t n_00;
  uint64_t uVar5;
  uint64_t dd_00;
  uint64_t to;
  char *pcVar6;
  MTBDD high;
  MTBDD low;
  mtbddnode_t n;
  MTBDD dd;
  size_t i;
  size_t nodecount;
  sylvan_skiplist_t sl_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"[\n");
  sVar3 = sylvan_skiplist_count(sl);
  for (dd = 1; dd <= sVar3; dd = dd + 1) {
    MVar4 = sylvan_skiplist_getr(sl,dd);
    n_00 = MTBDD_GETNODE(MVar4);
    iVar1 = mtbddnode_isleaf(n_00);
    if (iVar1 == 0) {
      uVar5 = mtbddnode_getlow(n_00);
      uVar5 = sylvan_skiplist_get(sl,uVar5);
      dd_00 = mtbddnode_gethigh(n_00);
      MVar4 = MTBDD_STRIPMARK(dd_00);
      to = sylvan_skiplist_get(sl,MVar4);
      MVar4 = MTBDD_TRANSFERMARK(dd_00,to);
      uVar2 = mtbddnode_getvariable(n_00);
      iVar1 = MTBDD_HASMARK(MVar4);
      pcVar6 = "";
      if (iVar1 != 0) {
        pcVar6 = "~";
      }
      MVar4 = MTBDD_STRIPMARK(MVar4);
      fprintf((FILE *)out,"  node(%zu,%u,%zu,%s%zu),\n",dd,(ulong)uVar2,uVar5,pcVar6,MVar4);
    }
    else {
      uVar2 = mtbddnode_gettype(n_00);
      fprintf((FILE *)out,"  leaf(%zu,%u,\"",dd,(ulong)uVar2);
      MVar4 = MTBDD_STRIPMARK(MVar4);
      mtbdd_fprint_leaf(out,MVar4);
      fprintf((FILE *)out,"\"),\n");
    }
  }
  fprintf((FILE *)out,"]");
  return;
}

Assistant:

void
mtbdd_writer_writetext(FILE *out, sylvan_skiplist_t sl)
{
    fprintf(out, "[\n");
    size_t nodecount = sylvan_skiplist_count(sl);
    for (size_t i=1; i<=nodecount; i++) {
        MTBDD dd = sylvan_skiplist_getr(sl, i);

        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_isleaf(n)) {
            /* serialize leaf, does not support customs yet */
            fprintf(out, "  leaf(%zu,%u,\"", i, mtbddnode_gettype(n));
            mtbdd_fprint_leaf(out, MTBDD_STRIPMARK(dd));
            fprintf(out, "\"),\n");
        } else {
            MTBDD low = sylvan_skiplist_get(sl, mtbddnode_getlow(n));
            MTBDD high = mtbddnode_gethigh(n);
            high = MTBDD_TRANSFERMARK(high, sylvan_skiplist_get(sl, MTBDD_STRIPMARK(high)));
            fprintf(out, "  node(%zu,%u,%zu,%s%zu),\n", i, mtbddnode_getvariable(n), (size_t)low, MTBDD_HASMARK(high)?"~":"", (size_t)MTBDD_STRIPMARK(high));
        }
    }

    fprintf(out, "]");
}